

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

void test_2d_static<5ul,5ul,30ul,30ul>(void)

{
  int iVar1;
  bool *pbVar2;
  char *pcVar3;
  bool *pbVar4;
  int i;
  long lVar5;
  ulong uVar6;
  int i_1;
  size_t true_idx;
  int dptr [1225];
  bool *local_1380;
  bool *local_1378;
  bool *local_1370;
  bool *local_1368;
  bool *local_1360;
  bool local_1358 [4904];
  
  local_1358[0] = true;
  local_1378 = (bool *)CONCAT71(local_1378._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",local_1358,
             (bool *)&local_1378);
  local_1358[0] = true;
  local_1358[1] = false;
  local_1358[2] = false;
  local_1358[3] = false;
  local_1358[4] = false;
  local_1358[5] = false;
  local_1358[6] = false;
  local_1358[7] = false;
  local_1378._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_1358,(int *)&local_1378);
  local_1358[0] = true;
  local_1358[1] = false;
  local_1358[2] = false;
  local_1358[3] = false;
  local_1358[4] = false;
  local_1358[5] = false;
  local_1358[6] = false;
  local_1358[7] = false;
  local_1378 = (bool *)CONCAT44(local_1378._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_1358,(int *)&local_1378);
  local_1358[0] = true;
  local_1358[1] = true;
  local_1358[2] = false;
  local_1358[3] = false;
  local_1358[4] = false;
  local_1358[5] = false;
  local_1358[6] = false;
  local_1358[7] = false;
  local_1378 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_1358,(unsigned_long *)&local_1378);
  local_1358[0] = true;
  local_1358[1] = true;
  local_1358[2] = false;
  local_1358[3] = false;
  local_1358[4] = false;
  local_1358[5] = false;
  local_1358[6] = false;
  local_1358[7] = false;
  local_1378 = (bool *)0x4c9;
  pbVar4 = local_1358;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)pbVar4,(unsigned_long *)&local_1378);
  local_1370 = (bool *)0x0;
  do {
    lVar5 = 0;
    local_1368 = pbVar4;
    do {
      local_1380 = (bool *)((long)local_1370 + lVar5);
      local_1378 = local_1380;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_1380,(unsigned_long *)&local_1378);
      local_1360 = local_1358 + (long)local_1378 * 4;
      local_1380 = pbVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (int **)&local_1380,(int **)&local_1360);
      pbVar4[0] = true;
      pbVar4[1] = false;
      pbVar4[2] = false;
      pbVar4[3] = false;
      local_1380 = (bool *)CONCAT44(local_1380._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",(int *)pbVar4,
                 (int *)&local_1380);
      lVar5 = lVar5 + 0x23;
      pbVar4 = pbVar4 + 0x8c;
    } while (lVar5 != 0x41a);
    local_1370 = (bool *)((long)local_1370 + 1);
    pbVar4 = local_1368 + 4;
  } while (local_1370 != (bool *)0x1e);
  pbVar4 = local_1358;
  pbVar2 = (bool *)0x0;
  do {
    uVar6 = 0;
    local_1370 = pbVar2;
    local_1368 = pbVar4;
    do {
      local_1380 = pbVar2;
      local_1378 = pbVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_1380,(unsigned_long *)&local_1378);
      local_1360 = local_1358 + (long)local_1378 * 4;
      local_1380 = pbVar4;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (int **)&local_1380,(int **)&local_1360);
      if (uVar6 < 0x1e) {
        if ((bool *)0x1d < local_1370) {
          pbVar4[0] = true;
          pbVar4[1] = false;
          pbVar4[2] = false;
          pbVar4[3] = false;
          local_1380 = (bool *)CONCAT44(local_1380._4_4_,0x18);
          pcVar3 = "24";
          iVar1 = 0x4d;
          goto LAB_00104ba3;
        }
      }
      else {
        pbVar4[0] = true;
        pbVar4[1] = false;
        pbVar4[2] = false;
        pbVar4[3] = false;
        local_1380 = (bool *)CONCAT44(local_1380._4_4_,0x11);
        pcVar3 = "17";
        iVar1 = 0x45;
LAB_00104ba3:
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])",pcVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,iVar1,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                   (int *)pbVar4,(int *)&local_1380);
      }
      uVar6 = uVar6 + 1;
      pbVar2 = pbVar2 + 0x23;
      pbVar4 = pbVar4 + 0x8c;
    } while (uVar6 != 0x23);
    pbVar2 = local_1370 + 1;
    pbVar4 = local_1368 + 4;
    if (pbVar2 == (bool *)&DAT_00000023) {
      pbVar4 = local_1358;
      pbVar2 = (bool *)0x0;
      do {
        uVar6 = 0;
        local_1370 = pbVar2;
        local_1368 = pbVar4;
        do {
          local_1380 = pbVar2;
          local_1378 = pbVar2;
          boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                    ("(l.index(i, j))","true_idx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x57,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (unsigned_long *)&local_1380,(unsigned_long *)&local_1378);
          local_1360 = local_1358 + (long)local_1378 * 4;
          local_1380 = pbVar4;
          boost::detail::test_eq_impl<int*,int*>
                    ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x59,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int **)&local_1380,(int **)&local_1360);
          if (uVar6 < 0x1e) {
            if (local_1370 < (bool *)0x1e) {
              local_1380 = (bool *)CONCAT44(local_1380._4_4_,0x2a);
              pcVar3 = "42";
              iVar1 = 0x6a;
            }
            else {
              local_1380 = (bool *)CONCAT44(local_1380._4_4_,0x18);
              pcVar3 = "24";
              iVar1 = 100;
            }
          }
          else {
            local_1380 = (bool *)CONCAT44(local_1380._4_4_,0x11);
            pcVar3 = "17";
            iVar1 = 0x5e;
          }
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])",pcVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,iVar1,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int *)pbVar4,(int *)&local_1380);
          uVar6 = uVar6 + 1;
          pbVar2 = pbVar2 + 0x23;
          pbVar4 = pbVar4 + 0x8c;
        } while (uVar6 != 0x23);
        pbVar2 = local_1370 + 1;
        pbVar4 = local_1368 + 4;
      } while (pbVar2 != (bool *)&DAT_00000023);
      return;
    }
  } while( true );
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}